

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnDataDrop(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result rhs;
  char *pcVar1;
  int __c;
  Var local_78;
  Enum local_2c;
  Var *local_28;
  Var *segment_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = segment_var;
  segment_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = &segment_var_local->loc;
  Var::Var(&local_78,segment_var);
  local_2c = (Enum)CheckDataSegmentIndex(this,&local_78);
  pcVar1 = (char *)(ulong)local_2c;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_2c);
  Var::~Var(&local_78);
  pcVar1 = Var::index(segment_var,pcVar1,__c);
  rhs = TypeChecker::OnDataDrop(&this->typechecker_,(uint32_t)pcVar1);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnDataDrop(const Location& loc, Var segment_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnDataDrop(segment_var.index());
  return result;
}